

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O2

double __thiscall
ProbabEstimator::getProbabLtFast1
          (ProbabEstimator *this,double maxValInReplaced,int numReplaced,int pathLength)

{
  int i;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  DistribFunction *this_00;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double vals [20];
  
  this_00 = this->distribFunction;
  uVar2 = (ulong)(uint)numReplaced;
  dVar6 = DistribFunction::getDistrib(this_00,maxValInReplaced);
  dVar8 = 1.0;
  vals[0] = 1.0;
  uVar5 = (ulong)(uint)(~(numReplaced >> 0x1f) & numReplaced);
  uVar1 = 0;
  iVar3 = pathLength;
  while (uVar5 != uVar1) {
    dVar7 = (double)iVar3;
    vals[uVar1] = dVar8;
    uVar1 = uVar1 + 1;
    iVar3 = iVar3 + -1;
    dVar8 = (dVar8 * dVar7) / (double)(int)uVar1;
  }
  dVar8 = 1.0 - dVar6;
  for (lVar4 = 1; lVar4 < numReplaced; lVar4 = lVar4 + 1) {
    dVar7 = dVar8 * vals[lVar4];
    dVar8 = dVar8 * (1.0 - dVar6);
    vals[lVar4] = dVar7;
  }
  dVar8 = pown((ProbabEstimator *)this_00,dVar6,(pathLength - numReplaced) + 1);
  for (; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
    dVar7 = dVar8 * vals[uVar2 - 1];
    dVar8 = dVar8 * dVar6;
    vals[uVar2 - 1] = dVar7;
  }
  dVar6 = 0.0;
  for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
    dVar6 = dVar6 + vals[uVar2];
  }
  return dVar6;
}

Assistant:

double ProbabEstimator::getProbabLtFast1( const double maxValInReplaced, const int numReplaced, const int pathLength ){
    double  PAr1 = distribFunction->getDistrib( maxValInReplaced );
    double cPAr1 = 1.0-PAr1;
    double vals[20]; vals[0] = 1.0;

    double val = 1.0;
    for ( int i = 0; i < numReplaced; ++i ){ vals[i] = val; val *= (double)(pathLength-i)/(double)(i+1); }
    val = cPAr1; 
    for ( int i = 1; i < numReplaced; ++i ){ vals[i] *= val; val *= cPAr1; }
    val = pown( PAr1, pathLength-numReplaced+1 );
    for ( int i = numReplaced-1; i >= 0; --i ){ vals[i] *= val; val *= PAr1; }
    val = 0.0;
    for ( int i = 0; i < numReplaced; ++i ) val += vals[i];
    return val;
}